

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

float MARGINAL::get_adanormalhedge_weights(float R,float C)

{
  float in_XMM0_Da;
  double dVar1;
  float in_XMM1_Da;
  float Rpos;
  float local_14;
  float local_4;
  
  local_14 = in_XMM0_Da;
  if (in_XMM0_Da <= 0.0) {
    local_14 = 0.0;
  }
  if (((in_XMM1_Da == 0.0) && (!NAN(in_XMM1_Da))) || ((local_14 == 0.0 && (!NAN(local_14))))) {
    local_4 = 0.0;
  }
  else {
    dVar1 = std::exp((double)(ulong)(uint)((local_14 * local_14) / (in_XMM1_Da * 3.0)));
    local_4 = (local_14 * 2.0 * SUB84(dVar1,0)) / (in_XMM1_Da * 3.0);
  }
  return local_4;
}

Assistant:

float get_adanormalhedge_weights(float R, float C)
{
  float Rpos = R > 0 ? R : 0.f;
  if (C == 0. || Rpos == 0.)
    return 0;
  return 2 * Rpos * correctedExp(Rpos * Rpos / (3 * C)) / (3 * C);
}